

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cc
# Opt level: O0

void __thiscall TypeArray::printRaw(TypeArray *this,ostream *s)

{
  ostream *poVar1;
  void *this_00;
  ostream *s_local;
  TypeArray *this_local;
  
  (*this->arrayof->_vptr_Datatype[3])(this->arrayof,s);
  poVar1 = std::operator<<(s," [");
  this_00 = (void *)std::ostream::operator<<(poVar1,std::dec);
  poVar1 = (ostream *)std::ostream::operator<<(this_00,this->arraysize);
  std::operator<<(poVar1,']');
  return;
}

Assistant:

void TypeArray::printRaw(ostream &s) const

{
  arrayof->printRaw(s);
  s << " [" << dec << arraysize << ']';
}